

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PyCode.cc
# Opt level: O2

int __thiscall PyCode::mainFunc(PyCode *this,string *cwd)

{
  int iVar1;
  ostream *poVar2;
  long *plVar3;
  char *pcVar4;
  int extraout_EDX;
  string *psVar5;
  PyCode *this_00;
  
  this_00 = (PyCode *)&stack0xffffffffffffff68;
  poVar2 = std::operator<<((ostream *)&std::cout,">>Now generating MFStruct.py");
  std::endl<char,std::char_traits<char>>(poVar2);
  psVar5 = (string *)&stack0xffffffffffffffc8;
  std::__cxx11::string::string(psVar5,(string *)cwd);
  generateMFStructPy((PyCode *)psVar5,(string *)&stack0xffffffffffffffc8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  poVar2 = std::operator<<((ostream *)&std::cout,">>Now generating PostrgresCon.py");
  std::endl<char,std::char_traits<char>>(poVar2);
  psVar5 = (string *)&stack0xffffffffffffffa8;
  std::__cxx11::string::string(psVar5,(string *)cwd);
  generatePostgresConPy((PyCode *)psVar5,(string *)&stack0xffffffffffffffa8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  poVar2 = std::operator<<((ostream *)&std::cout,">>Now generating Main.py");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff88,(string *)cwd);
  generateMainPy(this,(string *)&stack0xffffffffffffff88);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff68,(string *)cwd);
  iVar1 = generateRequirements(this_00,(string *)&stack0xffffffffffffff68);
  if (extraout_EDX == 2) {
    plVar3 = (long *)__cxa_begin_catch(iVar1);
    pcVar4 = (char *)(**(code **)(*plVar3 + 0x10))(plVar3);
    poVar2 = std::operator<<((ostream *)&std::cout,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar2);
    __cxa_end_catch();
    return -1;
  }
  __clang_call_terminate(iVar1);
}

Assistant:

int PyCode::mainFunc(std::string cwd) noexcept
{
    try
    {
        std::cout << ">>Now generating MFStruct.py" << std::endl;
        this->generateMFStructPy(cwd);
        std::cout << ">>Now generating PostrgresCon.py" << std::endl;
        this->generatePostgresConPy(cwd);
        std::cout << ">>Now generating Main.py" << std::endl;
        this->generateMainPy(cwd);
        this->generateRequirements(cwd);
    }
    catch(ParserClassException::FileNotOpenException &e)
    {
        std::cout << e.what() << std::endl;
        return -1;
    }
    return 0;
}